

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_utils.h
# Opt level: O0

void check_reset_rc_flag(AV1_COMP *cpi)

{
  AV1_PRIMARY *pAVar1;
  AV1_COMP *in_RDI;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  
  pAVar1 = in_RDI->ppi;
  if ((uint)(in_RDI->svc).number_spatial_layers < (in_RDI->common).current_frame.frame_number) {
    if (in_RDI->ppi->use_svc == 0) {
      if (((in_RDI->rc).prev_avg_frame_bandwidth >> 1 < (in_RDI->rc).avg_frame_bandwidth / 3) ||
         ((in_RDI->rc).avg_frame_bandwidth < (in_RDI->rc).prev_avg_frame_bandwidth >> 1)) {
        (in_RDI->rc).rc_1_frame = 0;
        (in_RDI->rc).rc_2_frame = 0;
        (pAVar1->p_rc).bits_off_target = (pAVar1->p_rc).optimal_buffer_level;
        (pAVar1->p_rc).buffer_level = (pAVar1->p_rc).optimal_buffer_level;
      }
    }
    else {
      av1_svc_check_reset_layer_rc_flag(in_RDI);
    }
  }
  return;
}

Assistant:

static inline void check_reset_rc_flag(AV1_COMP *cpi) {
  RATE_CONTROL *rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  if (cpi->common.current_frame.frame_number >
      (unsigned int)cpi->svc.number_spatial_layers) {
    if (cpi->ppi->use_svc) {
      av1_svc_check_reset_layer_rc_flag(cpi);
    } else {
      if (rc->avg_frame_bandwidth / 3 > (rc->prev_avg_frame_bandwidth >> 1) ||
          rc->avg_frame_bandwidth < (rc->prev_avg_frame_bandwidth >> 1)) {
        rc->rc_1_frame = 0;
        rc->rc_2_frame = 0;
        p_rc->bits_off_target = p_rc->optimal_buffer_level;
        p_rc->buffer_level = p_rc->optimal_buffer_level;
      }
    }
  }
}